

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O0

bool IsCompileableFile(string *ext)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int iVar1;
  size_type sVar2;
  string *this;
  key_type *in_stack_fffffffffffffe48;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe50;
  key_equal *in_stack_fffffffffffffe58;
  hasher *in_stack_fffffffffffffe60;
  size_type in_stack_fffffffffffffe68;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe70;
  iterator in_stack_fffffffffffffe78;
  size_type in_stack_fffffffffffffe80;
  allocator_type *in_stack_fffffffffffffe90;
  undefined1 local_fd [5];
  allocator local_f8;
  allocator local_f7;
  allocator local_f6;
  allocator local_f5 [20];
  allocator local_e1;
  string *local_e0;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  string *local_18;
  undefined8 local_10;
  
  if (IsCompileableFile(std::__cxx11::string_const&)::exts_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&IsCompileableFile(std::__cxx11::string_const&)::exts_abi_cxx11_);
    if (iVar1 != 0) {
      local_fd[3] = 1;
      local_e0 = local_d8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,".c",&local_e1);
      local_e0 = local_b8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,".C",local_f5);
      local_e0 = local_98;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,".cc",&local_f6);
      local_e0 = local_78;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,".cpp",&local_f7);
      local_e0 = local_58;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_58,".m",&local_f8);
      local_e0 = local_38;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_38,".mm",(allocator *)(local_fd + 4));
      local_fd[3] = 0;
      local_18 = local_d8;
      local_10 = 6;
      in_stack_fffffffffffffe48 = (key_type *)local_fd;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x173cf3);
      __l._M_len = in_stack_fffffffffffffe80;
      __l._M_array = in_stack_fffffffffffffe78;
      std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::unordered_set(in_stack_fffffffffffffe70,__l,in_stack_fffffffffffffe68,
                      in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe90)
      ;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x173d3d);
      this = (string *)&local_18;
      do {
        this = this + -0x20;
        std::__cxx11::string::~string(this);
      } while (this != local_d8);
      std::allocator<char>::~allocator((allocator<char> *)(local_fd + 4));
      std::allocator<char>::~allocator((allocator<char> *)&local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f7);
      std::allocator<char>::~allocator((allocator<char> *)&local_f6);
      std::allocator<char>::~allocator((allocator<char> *)local_f5);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      __cxa_atexit(std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,&IsCompileableFile(std::__cxx11::string_const&)::exts_abi_cxx11_
                   ,&__dso_handle);
      __cxa_guard_release(&IsCompileableFile(std::__cxx11::string_const&)::exts_abi_cxx11_);
    }
  }
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  return sVar2 != 0;
}

Assistant:

bool IsCompileableFile(const std::string& ext) {
    static const std::unordered_set<std::string> exts = { ".c", ".C", ".cc", ".cpp", ".m", ".mm" };
    return exts.count(ext) > 0;
}